

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

bool SetNameProxy(Proxy *addrProxy)

{
  bool bVar1;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock7;
  GlobalMutex *in_stack_ffffffffffffffb8;
  Proxy *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  byte bVar2;
  char *in_stack_ffffffffffffffe8;
  GlobalMutex *in_stack_fffffffffffffff0;
  UniqueLock<GlobalMutex> *this;
  
  this = *(UniqueLock<GlobalMutex> **)(in_FS_OFFSET + 0x28);
  bVar1 = Proxy::IsValid(in_stack_ffffffffffffffc0);
  if (bVar1) {
    MaybeCheckNotHeld<GlobalMutex>(in_stack_ffffffffffffffb8);
    UniqueLock<GlobalMutex>::UniqueLock
              (this,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
               (char *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
               (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    Proxy::operator=((Proxy *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0);
    bVar2 = 1;
    UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffffb8);
  }
  else {
    bVar2 = 0;
  }
  if (*(UniqueLock<GlobalMutex> **)(in_FS_OFFSET + 0x28) == this) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool SetNameProxy(const Proxy &addrProxy) {
    if (!addrProxy.IsValid())
        return false;
    LOCK(g_proxyinfo_mutex);
    nameProxy = addrProxy;
    return true;
}